

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

MapFieldBase * __thiscall
google::protobuf::Reflection::MutableMapData
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  MapFieldBase *pMVar2;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = anon_unknown_6::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetMapData","Field is not a map field.");
  }
  pMVar2 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
  return pMVar2;
}

Assistant:

MapFieldBase* Reflection::MutableMapData(Message* message,
                                         const FieldDescriptor* field) const {
  USAGE_CHECK(IsMapFieldInApi(field), GetMapData, "Field is not a map field.");
  return MutableRaw<MapFieldBase>(message, field);
}